

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O3

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::rescale
          (ExponentiallyDecayingReservoir *this,time_t now,time_t next)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  mapped_type *this_00;
  iterator __position;
  __node_base _Var12;
  double dVar13;
  unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_> keys;
  double local_80;
  WeightedSample local_78;
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  this->m_next_rescale_time = now + 0x3c;
  lVar4 = this->m_start;
  iVar8 = (*this->m_clock->_vptr_Clock[1])();
  this->m_start = CONCAT44(extraout_var,iVar8);
  dVar7 = exp((double)(CONCAT44(extraout_var,iVar8) - lVar4) * -this->m_alpha);
  if (dVar7 == 0.0) {
    std::
    _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
    ::clear(&(this->m_samples)._M_t);
  }
  else {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    sVar2 = (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    dVar13 = ((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    uVar9 = (ulong)dVar13;
    std::
    _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::rehash(&local_68,(long)(dVar13 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
    p_Var10 = (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_samples)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      do {
        local_78.m_value = (long)&local_68;
        std::
        _Hashtable<double,double,std::allocator<double>,std::__detail::_Identity,std::equal_to<double>,std::hash<double>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<double_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<double,false>>>>
                  ((_Hashtable<double,double,std::allocator<double>,std::__detail::_Identity,std::equal_to<double>,std::hash<double>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,p_Var10 + 1,&local_78);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var1);
    }
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var12._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        p_Var11 = (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var11 == (_Base_ptr)0x0) {
LAB_00112c4b:
          __assert_fail("it != m_samples.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/benjamin-bader[P]cppmetrics/metrics/src/ExponentiallyDecayingReservoir.cc"
                        ,0xc0,
                        "void cppmetrics::ExponentiallyDecayingReservoir::rescale(std::time_t, std::time_t)"
                       );
        }
        p_Var3 = _Var12._M_nxt[1]._M_nxt;
        __position._M_node = &p_Var1->_M_header;
        do {
          bVar5 = (double)p_Var3 != *(double *)(p_Var11 + 1);
          bVar6 = *(double *)(p_Var11 + 1) <= (double)p_Var3;
          if (!bVar6 || !bVar5) {
            __position._M_node = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[bVar6 && bVar5];
        } while (p_Var11 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
           ((double)p_Var3 < *(double *)(__position._M_node + 1))) goto LAB_00112c4b;
        p_Var10 = __position._M_node[1]._M_parent;
        dVar13 = (double)__position._M_node[1]._M_left * dVar7;
        std::
        _Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                            *)&this->m_samples,__position);
        if (dVar13 != 0.0) {
          WeightedSample::WeightedSample(&local_78,(long)p_Var10,dVar13);
          local_80 = (double)_Var12._M_nxt[1]._M_nxt * dVar7;
          this_00 = std::
                    map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                    ::operator[](&this->m_samples,&local_80);
          WeightedSample::operator=(this_00,&local_78);
        }
        _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
      } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
    }
    std::
    _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i =
       (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ExponentiallyDecayingReservoir::rescale(std::time_t now, std::time_t next)
{
  std::lock_guard<std::mutex> lock(m_mutex);

  m_next_rescale_time = now + kRescalePeriod;
  const auto old_start_time = m_start;
  m_start = m_clock->now_as_time_t();

  const double scaling_factor = exp(-m_alpha * (m_start - old_start_time));
  if (HasEquivalentOrder(scaling_factor, 0.0))
  {
    m_samples.clear();
  }
  else
  {
    std::unordered_set<double> keys;
    keys.reserve(m_samples.size());
    for (auto&& pair : m_samples)
    {
      keys.insert(pair.first);
    }

    for (auto&& key : keys)
    {
      auto it = m_samples.find(key);
      assert(it != m_samples.end());
      auto value = it->second.get_value();
      auto new_weight = it->second.get_weight() * scaling_factor;
      m_samples.erase(it);

      if (!HasEquivalentOrder(new_weight, 0))
      {
        m_samples[key * scaling_factor] = {value, new_weight};
      }
    }
  }

  m_count.store(m_samples.size());
}